

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSet.cxx
# Opt level: O3

bool __thiscall cmExportSet::Compute(cmExportSet *this,cmLocalGenerator *lg)

{
  pointer pbVar1;
  cmLocalGenerator *pcVar2;
  bool bVar3;
  cmGeneratorTarget *pcVar4;
  pointer puVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  long lVar7;
  long lVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interfaceFileSets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  pointer local_50;
  cmLocalGenerator *local_48;
  pointer local_40;
  cmLocalGenerator *local_38;
  
  puVar5 = (this->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50 = (this->TargetExports).
             super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != local_50) {
    local_48 = lg;
    do {
      pcVar2 = local_48;
      pcVar4 = cmLocalGenerator::FindGeneratorTargetToUse
                         (local_48,&((puVar5->_M_t).
                                     super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                                     .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->
                                    TargetName);
      ((puVar5->_M_t).super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>.
       _M_t.super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
       super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target = pcVar4;
      cmTarget::GetAllInterfaceFileSets_abi_cxx11_
                (&local_68,
                 ((puVar5->_M_t).
                  super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                  super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                  super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target->Target);
      pbVar1 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_38 = pcVar2;
      lVar7 = (long)local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      __it._M_current =
           local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_40 = puVar5;
      if (0 < lVar7 >> 7) {
        lVar8 = (lVar7 >> 7) + 1;
        do {
          bVar3 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
                  operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40
                             ,__it);
          _Var6._M_current = __it._M_current;
          if (bVar3) goto LAB_0050b482;
          bVar3 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
                  operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40
                             ,__it._M_current + 1);
          _Var6._M_current = __it._M_current + 1;
          if (bVar3) goto LAB_0050b482;
          bVar3 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
                  operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40
                             ,__it._M_current + 2);
          _Var6._M_current = __it._M_current + 2;
          if (bVar3) goto LAB_0050b482;
          bVar3 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
                  operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40
                             ,__it._M_current + 3);
          _Var6._M_current = __it._M_current + 3;
          if (bVar3) goto LAB_0050b482;
          __it._M_current = __it._M_current + 4;
          lVar8 = lVar8 + -1;
          lVar7 = lVar7 + -0x80;
        } while (1 < lVar8);
      }
      lVar7 = lVar7 >> 5;
      if (lVar7 == 1) {
LAB_0050b46e:
        bVar3 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
                operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40,
                           __it);
        _Var6._M_current = __it._M_current;
        if (!bVar3) {
          _Var6._M_current = pbVar1;
        }
LAB_0050b482:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        if (_Var6._M_current != pbVar1) {
          return false;
        }
      }
      else {
        if (lVar7 == 2) {
LAB_0050b44f:
          bVar3 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
                  operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40
                             ,__it);
          _Var6._M_current = __it._M_current;
          if (!bVar3) {
            __it._M_current = __it._M_current + 1;
            goto LAB_0050b46e;
          }
          goto LAB_0050b482;
        }
        if (lVar7 == 3) {
          bVar3 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
                  operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40
                             ,__it);
          _Var6._M_current = __it._M_current;
          if (!bVar3) {
            __it._M_current = __it._M_current + 1;
            goto LAB_0050b44f;
          }
          goto LAB_0050b482;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != local_50);
  }
  return true;
}

Assistant:

bool cmExportSet::Compute(cmLocalGenerator* lg)
{
  for (std::unique_ptr<cmTargetExport>& tgtExport : this->TargetExports) {
    tgtExport->Target = lg->FindGeneratorTargetToUse(tgtExport->TargetName);

    auto const interfaceFileSets =
      tgtExport->Target->Target->GetAllInterfaceFileSets();
    auto const fileSetInTargetExport =
      [&tgtExport, lg](const std::string& fileSetName) -> bool {
      auto* fileSet = tgtExport->Target->Target->GetFileSet(fileSetName);

      if (!tgtExport->FileSetGenerators.count(fileSet)) {
        lg->IssueMessage(MessageType::FATAL_ERROR,
                         cmStrCat("File set \"", fileSetName,
                                  "\" is listed in interface file sets of ",
                                  tgtExport->Target->GetName(),
                                  " but has not been exported"));
        return false;
      }
      return true;
    };

    if (!std::all_of(interfaceFileSets.begin(), interfaceFileSets.end(),
                     fileSetInTargetExport)) {
      return false;
    }
  }

  return true;
}